

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O3

string * cmSystemTools::FileExistsInParentDirectories
                   (string *__return_storage_ptr__,string *fname,string *directory,string *toplevel)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  long lVar4;
  _Alloc_hider _Var5;
  size_type sVar6;
  bool bVar7;
  int iVar8;
  long *plVar9;
  size_type *psVar10;
  string dir;
  string prevDir;
  string file;
  string local_b8;
  string local_98;
  undefined1 *local_78;
  size_t local_70;
  undefined1 local_68;
  undefined7 uStack_67;
  string local_58;
  string *local_38;
  
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  pcVar3 = (fname->_M_dataplus)._M_p;
  local_38 = toplevel;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_58,pcVar3,pcVar3 + fname->_M_string_length);
  cmsys::SystemTools::ConvertToUnixSlashes(&local_58);
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  pcVar3 = (directory->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_b8,pcVar3,pcVar3 + directory->_M_string_length);
  cmsys::SystemTools::ConvertToUnixSlashes(&local_b8);
  local_78 = &local_68;
  local_70 = 0;
  local_68 = 0;
  paVar2 = &local_98.field_2;
  paVar1 = &__return_storage_ptr__->field_2;
  do {
    sVar6 = local_b8._M_string_length;
    _Var5._M_p = local_b8._M_dataplus._M_p;
    if ((local_b8._M_string_length == local_70) &&
       ((local_b8._M_string_length == 0 ||
        (iVar8 = bcmp(local_b8._M_dataplus._M_p,local_78,local_b8._M_string_length), iVar8 == 0))))
    goto LAB_001a8b81;
    local_98._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char*>((string *)&local_98,_Var5._M_p,_Var5._M_p + sVar6);
    std::__cxx11::string::append((char *)&local_98);
    plVar9 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_98,(ulong)local_58._M_dataplus._M_p);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)paVar1;
    psVar10 = (size_type *)(plVar9 + 2);
    if ((size_type *)*plVar9 == psVar10) {
      lVar4 = plVar9[3];
      paVar1->_M_allocated_capacity = *psVar10;
      *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar4;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar9;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar10;
    }
    __return_storage_ptr__->_M_string_length = plVar9[1];
    *plVar9 = (long)psVar10;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != paVar2) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
    bVar7 = cmsys::SystemTools::FileExists(__return_storage_ptr__);
    if (bVar7) goto LAB_001a8b96;
    iVar8 = 3;
    if (local_38->_M_string_length <= local_b8._M_string_length) {
      std::__cxx11::string::_M_assign((string *)&local_78);
      cmsys::SystemTools::GetParentDirectory(&local_98,&local_b8);
      std::__cxx11::string::operator=((string *)&local_b8,(string *)&local_98);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != paVar2) {
        operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
      }
      iVar8 = 0;
    }
    pcVar3 = (__return_storage_ptr__->_M_dataplus)._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar3 != paVar1) {
      operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
    }
  } while (iVar8 == 0);
  if (iVar8 == 3) {
LAB_001a8b81:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  }
LAB_001a8b96:
  if (local_78 != &local_68) {
    operator_delete(local_78,CONCAT71(uStack_67,local_68) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmSystemTools::FileExistsInParentDirectories(
  const std::string& fname, const std::string& directory,
  const std::string& toplevel)
{
  std::string file = fname;
  cmSystemTools::ConvertToUnixSlashes(file);
  std::string dir = directory;
  cmSystemTools::ConvertToUnixSlashes(dir);
  std::string prevDir;
  while (dir != prevDir) {
    std::string path = dir + "/" + file;
    if (cmSystemTools::FileExists(path)) {
      return path;
    }
    if (dir.size() < toplevel.size()) {
      break;
    }
    prevDir = dir;
    dir = cmSystemTools::GetParentDirectory(dir);
  }
  return "";
}